

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreakOperator.cpp
# Opt level: O3

void __thiscall lts2::FreakOperator::Apply(FreakOperator *this,Mat *X,Mat *Ax)

{
  Mat *pMVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  _InputArray local_68;
  undefined8 uStack_50;
  _InputArray local_48;
  
  cv::Mat::create((int)Ax,*(int *)&(this->super_LBDOperator).super_LinearOperator.field_0xc,1);
  local_68.sz.width = 0;
  local_68.sz.height = 0;
  uStack_50 = 0;
  local_68.flags = 0;
  local_68._4_4_ = 0;
  local_68.obj = (void *)0x0;
  local_48.flags = -0x3efdfffa;
  local_48.sz.width = 1;
  local_48.sz.height = 4;
  local_48.obj = &local_68;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)Ax,&local_48);
  pMVar1 = &(this->super_LBDOperator)._integralImage;
  if (*(long *)&(this->super_LBDOperator).field_0x28 != 0) {
    local_68.sz.width = 0;
    local_68.sz.height = 0;
    uStack_50 = 0;
    local_68.flags = 0;
    local_68._4_4_ = 0;
    local_68.obj = (void *)0x0;
    local_48.flags = -0x3efdfffa;
    local_48.sz.width = 1;
    local_48.sz.height = 4;
    local_48.obj = &local_68;
    cv::noArray();
    cv::Mat::setTo((_InputArray *)pMVar1,&local_48);
  }
  local_68.sz.width = 0;
  local_68.sz.height = 0;
  local_68.flags = 0x1010000;
  local_48.sz.width = 0;
  local_48.sz.height = 0;
  local_48.flags = 0x2010000;
  local_68.obj = X;
  local_48.obj = pMVar1;
  cv::integral(&local_68,(_OutputArray *)&local_48,6);
  if (*(int *)&(this->super_LBDOperator).super_LinearOperator.field_0xc != 0) {
    lVar2 = *(long *)(Ax + 0x10);
    uVar5 = 0;
    do {
      dVar3 = LBDOperator::measureAtCell
                        (&this->super_LBDOperator,
                         (this->super_LBDOperator)._basisFunctions[uVar5].pos_cell);
      dVar4 = LBDOperator::measureAtCell
                        (&this->super_LBDOperator,
                         (this->super_LBDOperator)._basisFunctions[uVar5].neg_cell);
      *(float *)(lVar2 + uVar5 * 4) = (float)(dVar3 - dVar4);
      uVar5 = uVar5 + 1;
    } while (uVar5 < *(uint *)&(this->super_LBDOperator).super_LinearOperator.field_0xc);
  }
  return;
}

Assistant:

void lts2::FreakOperator::Apply(cv::Mat const& X, cv::Mat& Ax)
{
    // Create a column vector where rows = number_of_active_pairs
    Ax.create(_pairsInUse, 1, CV_32FC1);
    Ax.setTo(cv::Scalar(0));

    // Compute the integral image for later
    if (_integralImage.data)
        _integralImage.setTo(cv::Scalar(0));
    cv::integral(X, _integralImage, CV_64F);
    
    // Apply each pair
#ifdef WITH_DISPATCH
    dispatch_queue_t queue = dispatch_get_global_queue(DISPATCH_QUEUE_PRIORITY_HIGH, 0);
    dispatch_apply(_pairsInUse, queue,
                   ^(size_t i) {
                     double mes_pos = measureAtCell(_basisFunctions[i].pos_cell);
                     double mes_neg = measureAtCell(_basisFunctions[i].neg_cell);
                     *Ax.ptr<float>(i) = cv::saturate_cast<float>(mes_pos - mes_neg);
                   });
#else
    float* p_ax = Ax.ptr<float>(0);
    for (int i = 0; i < _pairsInUse; ++i)
    {
        double mes_pos = measureAtCell(_basisFunctions[i].pos_cell);
        double mes_neg = measureAtCell(_basisFunctions[i].neg_cell);
        
        *p_ax++ = cv::saturate_cast<float>(mes_pos - mes_neg);
    }
#endif
}